

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionBody::RecordNativeThrowMap
          (FunctionBody *this,SmallSpanSequenceIter *iter,uint32 nativeOffset,uint32 statementIndex,
          EntryPointInfo *entryPoint,uint loopNum)

{
  SmallSpanSequence *this_00;
  HeapAllocator *alloc;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  this_00 = EntryPointInfo::GetNativeThrowSpanSequence(entryPoint);
  if (this_00 == (SmallSpanSequence *)0x0) {
    if (statementIndex == 0xffffffff) {
      return;
    }
    local_70 = (undefined1  [8])&SmallSpanSequence::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_29f156b;
    data.filename._0_4_ = 0x582;
    data._32_8_ = entryPoint;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_70);
    this_00 = (SmallSpanSequence *)new<Memory::HeapAllocator>(0x18,alloc,0x2f6726);
    SmallSpanSequence::SmallSpanSequence(this_00);
    if (loopNum == 0xffffffff) {
      EntryPointInfo::SetNativeThrowSpanSequence((EntryPointInfo *)data._32_8_,this_00);
    }
    else {
      SetNativeThrowSpanSequence(this,this_00,loopNum,(LoopEntryPointInfo *)data._32_8_);
    }
  }
  else if (iter->accumulatedSourceBegin == statementIndex) {
    return;
  }
  local_70._4_4_ = nativeOffset;
  local_70._0_4_ = statementIndex;
  SmallSpanSequence::RecordARange(this_00,iter,(StatementData *)local_70);
  return;
}

Assistant:

void
    FunctionBody::RecordNativeThrowMap(SmallSpanSequenceIter& iter, uint32 nativeOffset, uint32 statementIndex, EntryPointInfo* entryPoint, uint loopNum)
    {
        SmallSpanSequence *pSpanSequence;

        pSpanSequence = entryPoint->GetNativeThrowSpanSequence();

        if (!pSpanSequence)
        {
            if (statementIndex == -1)
            {
                return; // No need to initialize native throw map for non-user code
            }

            pSpanSequence = HeapNew(SmallSpanSequence);
            if (loopNum == LoopHeader::NoLoop)
            {
                ((FunctionEntryPointInfo*) entryPoint)->SetNativeThrowSpanSequence(pSpanSequence);
            }
            else
            {
                this->SetNativeThrowSpanSequence(pSpanSequence, loopNum, (LoopEntryPointInfo*) entryPoint);
            }
        }
        else if (iter.accumulatedSourceBegin == static_cast<int>(statementIndex))
        {
            return; // Compress adjacent spans which share the same statementIndex
        }

        StatementData data;
        data.sourceBegin = static_cast<int>(statementIndex); // sourceBegin represents statementIndex here
        data.bytecodeBegin = static_cast<int>(nativeOffset); // bytecodeBegin represents nativeOffset here

        pSpanSequence->RecordARange(iter, &data);
    }